

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportInstallFileGenerator::GenerateImportFileConfig
          (cmExportInstallFileGenerator *this,string *config)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  ostream *poVar4;
  mapped_type *this_00;
  ostream *os;
  string local_498;
  undefined1 local_478 [8];
  ostringstream e;
  string local_300 [8];
  string se;
  cmGeneratedFileStream exportFileStream;
  string local_68;
  char local_42 [2];
  undefined1 local_40 [8];
  string fileName;
  string *config_local;
  cmExportInstallFileGenerator *this_local;
  
  fileName.field_2._8_8_ = config;
  bVar1 = cmInstallGenerator::InstallsForConfig(&this->IEGen->super_cmInstallGenerator,config);
  if (bVar1) {
    local_42[1] = 0x2f;
    local_42[0] = '-';
    cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char>
              ((string *)local_40,&(this->super_cmExportFileGenerator).FileDir,local_42 + 1,
               &(this->super_cmExportFileGenerator).FileBase,local_42);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cmsys::SystemTools::LowerCase(&local_68,(string *)fileName.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)local_40,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      std::__cxx11::string::operator+=((string *)local_40,"noconfig");
    }
    std::__cxx11::string::operator+=
              ((string *)local_40,(string *)&(this->super_cmExportFileGenerator).FileExt);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)((long)&se.field_2 + 8),(string *)local_40,true,None);
    bVar2 = std::ios::operator!((ios *)((long)&se.field_2 + *(long *)(se.field_2._8_8_ + -0x18) + 8)
                               );
    bVar1 = (bVar2 & 1) != 0;
    if (bVar1) {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
      poVar4 = std::operator<<((ostream *)local_478,"cannot write to file \"");
      poVar4 = std::operator<<(poVar4,(string *)local_40);
      poVar4 = std::operator<<(poVar4,"\": ");
      std::operator<<(poVar4,local_300);
      std::__cxx11::ostringstream::str();
      cmSystemTools::Error(&local_498);
      std::__cxx11::string::~string((string *)&local_498);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
      std::__cxx11::string::~string(local_300);
    }
    else {
      cmGeneratedFileStream::SetCopyIfDifferent
                ((cmGeneratedFileStream *)((long)&se.field_2 + 8),true);
      poVar4 = (ostream *)((long)&se.field_2 + 8);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[4])
                (this,poVar4,fileName.field_2._8_8_);
      cmExportFileGenerator::GenerateImportConfig
                (&this->super_cmExportFileGenerator,poVar4,(string *)fileName.field_2._8_8_);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[5])(this,poVar4);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this->ConfigImportFiles,(key_type *)fileName.field_2._8_8_);
      std::__cxx11::string::operator=((string *)this_00,(string *)local_40);
    }
    this_local._7_1_ = !bVar1;
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)((long)&se.field_2 + 8));
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateImportFileConfig(
  const std::string& config)
{
  // Skip configurations not enabled for this export.
  if (!this->IEGen->InstallsForConfig(config)) {
    return true;
  }

  // Construct the name of the file to generate.
  std::string fileName = cmStrCat(this->FileDir, '/', this->FileBase, '-');
  if (!config.empty()) {
    fileName += cmSystemTools::LowerCase(config);
  } else {
    fileName += "noconfig";
  }
  fileName += this->FileExt;

  // Open the output file to generate it.
  cmGeneratedFileStream exportFileStream(fileName, true);
  if (!exportFileStream) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  exportFileStream.SetCopyIfDifferent(true);
  std::ostream& os = exportFileStream;

  // Start with the import file header.
  this->GenerateImportHeaderCode(os, config);

  // Generate the per-config target information.
  this->GenerateImportConfig(os, config);

  // End with the import file footer.
  this->GenerateImportFooterCode(os);

  // Record this per-config import file.
  this->ConfigImportFiles[config] = fileName;

  return true;
}